

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall PDA::Transducer::Preprocessor::Preprocessor(Preprocessor *this,string *fileName)

{
  pointer pcVar1;
  char cVar2;
  NotFoundException *this_00;
  wstring line;
  wifstream inputFile;
  byte abStack_218 [488];
  
  (this->m_source)._M_dataplus._M_p = (pointer)&(this->m_source).field_2;
  (this->m_source)._M_string_length = 0;
  (this->m_source).field_2._M_local_buf[0] = L'\0';
  (this->m_currentFileName)._M_dataplus._M_p = (pointer)&(this->m_currentFileName).field_2;
  (this->m_currentFileName)._M_string_length = 0;
  (this->m_currentFileName).field_2._M_local_buf[0] = '\0';
  this->m_lineIndex = 0;
  std::__cxx11::string::_M_assign((string *)&this->m_currentFileName);
  std::wifstream::wifstream(&inputFile,(string *)&this->m_currentFileName,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    while ((abStack_218[*(long *)(_inputFile + -0x18)] & 5) == 0) {
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = L'\0';
      line._M_dataplus._M_p = (pointer)&line.field_2;
      std::getline<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
                ((wistream *)&inputFile,(wstring *)&line);
      std::__cxx11::wstring::append((wstring *)this);
      std::__cxx11::wstring::append((wchar_t *)this);
      std::__cxx11::wstring::~wstring((wstring *)&line);
    }
    execute(this);
    std::wifstream::~wifstream(&inputFile);
    return;
  }
  this_00 = (NotFoundException *)__cxa_allocate_exception(0x28);
  pcVar1 = (fileName->_M_dataplus)._M_p;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  std::__cxx11::wstring::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((wstring *)&line,pcVar1,pcVar1 + fileName->_M_string_length);
  Exception::NotFoundException::NotFoundException(this_00,&line);
  __cxa_throw(this_00,&Exception::NotFoundException::typeinfo,Exception::Exception::~Exception);
}

Assistant:

Preprocessor::Preprocessor(const std::string &fileName) : m_lineIndex(0)
{
    m_currentFileName = fileName;
    std::wifstream inputFile(m_currentFileName);
    if (inputFile.is_open())
    {
        while(inputFile)
        {
            std::wstring line;
            std::getline(inputFile, line);
            m_source.append(line);
            m_source.append(L"\r\n");
        }
    }
    else
    {
        throw PDA::Exception::NotFoundException(std::wstring(fileName.begin(), fileName.end()));
    }
    execute();
}